

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O2

void free_mob_index(MOB_INDEX_DATA *pMob)

{
  SHOP_DATA *pSVar1;
  
  free_pstring(pMob->player_name);
  free_pstring(pMob->short_descr);
  free_pstring(pMob->long_descr);
  free_pstring(pMob->description);
  pSVar1 = pMob->pShop;
  pSVar1->next = shop_free;
  shop_free = pSVar1;
  pMob->next = mob_index_free;
  mob_index_free = pMob;
  return;
}

Assistant:

void free_mob_index(MOB_INDEX_DATA *pMob)
{
	free_pstring(pMob->player_name);
	free_pstring(pMob->short_descr);
	free_pstring(pMob->long_descr);
	free_pstring(pMob->description);

	free_shop(pMob->pShop);

	pMob->next = mob_index_free;
	mob_index_free = pMob;
}